

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

void nivalis::anon_unknown_1::buf_add_screen_rectangle
               (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                *draw_buf,View *render_view,float x,float y,float w,float h,bool fill,color *c,
               float thickness,size_t rel_func)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  pointer pDVar4;
  pointer paVar5;
  double dVar6;
  bool bVar7;
  double *pdVar8;
  long lVar9;
  undefined7 in_register_00000011;
  color *other;
  double dVar10;
  DrawBufferObject rect;
  DrawBufferObject local_108;
  float local_88;
  float local_78;
  undefined1 local_68 [56];
  
  other = (color *)CONCAT71(in_register_00000011,fill);
  if (w <= 0.0) {
    return;
  }
  if (h <= 0.0) {
    return;
  }
  local_108.points.
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.points.
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.points.
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = y;
  local_78 = x;
  color::color::color(&local_108.c);
  paVar1 = &local_108.str.field_2;
  local_108.str._M_string_length = 0;
  local_108.str.field_2._M_local_buf[0] = '\0';
  local_108.type = FILLED_RECT;
  local_68._8_4_ = (float)SUB84((double)local_88,0);
  local_68._0_8_ = (double)local_78;
  local_68._12_4_ = (float)((ulong)(double)local_88 >> 0x20);
  local_68._24_4_ = SUB84((double)(h + local_88),0);
  local_68._16_8_ = (double)(w + local_78);
  local_68._28_4_ = (int)((ulong)(double)(h + local_88) >> 0x20);
  local_108.str._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
  _M_assign_aux<std::array<double,2ul>const*>
            ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&local_108,
             local_68);
  local_108.thickness = 0.0;
  dVar10 = render_view->xmax - render_view->xmin;
  dVar6 = render_view->ymax - render_view->ymin;
  if ((long)local_108.points.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_108.points.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    lVar9 = (long)local_108.points.
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_108.points.
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    iVar2 = render_view->swid;
    iVar3 = render_view->shigh;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    pdVar8 = (local_108.points.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 1;
    do {
      ((array<double,_2UL> *)(pdVar8 + -1))->_M_elems[0] =
           (((array<double,_2UL> *)(pdVar8 + -1))->_M_elems[0] / (double)iVar2) * dVar10 +
           render_view->xmin;
      *pdVar8 = (((double)iVar3 - *pdVar8) / (double)iVar3) * dVar6 + render_view->ymin;
      pdVar8 = pdVar8 + 2;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  pDVar4 = (draw_buf->
           super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_108.rel_func = (size_t)c;
  if (pDVar4 != (draw_buf->
                super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                )._M_impl.super__Vector_impl_data._M_start) {
    if (pDVar4[-1].type == FILLED_RECT) {
      paVar5 = pDVar4[-1].points.
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((((dVar6 * 1e-06 <=
             ABS(paVar5->_M_elems[1] -
                 (local_108.points.
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1])) ||
           (dVar6 * 1e-06 <=
            ABS(paVar5[1]._M_elems[1] -
                local_108.points.
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._M_elems[1]))) ||
          (dVar10 * 1e-06 <=
           ABS(paVar5[1]._M_elems[0] -
               (local_108.points.
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0]))) ||
         (bVar7 = color::color::operator==(&pDVar4[-1].c,other), !bVar7)) goto LAB_0014288c;
      pdVar8 = local_108.points.
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_elems;
      lVar9 = 0x10;
LAB_00142917:
      *(double *)
       ((long)(pDVar4[-1].points.
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9) = *pdVar8;
      goto LAB_00142947;
    }
LAB_0014288c:
    if (pDVar4[-1].type == FILLED_RECT) {
      paVar5 = pDVar4[-1].points.
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((ABS(paVar5->_M_elems[0] -
                (local_108.points.
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0]) < dVar10 * 1e-06) &&
          (ABS(paVar5[1]._M_elems[0] -
               local_108.points.
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_elems[0]) < dVar10 * 1e-06)) &&
         ((ABS(paVar5[1]._M_elems[1] -
               (local_108.points.
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1]) < dVar6 * 1e-06 &&
          (bVar7 = color::color::operator==(&pDVar4[-1].c,other), bVar7)))) {
        pdVar8 = local_108.points.
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_elems + 1;
        lVar9 = 0x18;
        goto LAB_00142917;
      }
    }
  }
  color::color::operator=((color *)local_68,&local_108.c,other);
  std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
  emplace_back<nivalis::DrawBufferObject>(draw_buf,&local_108);
LAB_00142947:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.str._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.str._M_dataplus._M_p,
                    CONCAT71(local_108.str.field_2._M_allocated_capacity._1_7_,
                             local_108.str.field_2._M_local_buf[0]) + 1);
  }
  if (local_108.points.
      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.points.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.points.
                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.points.
                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void buf_add_screen_rectangle(
        std::vector<DrawBufferObject>& draw_buf,
        const Plotter::View& render_view,
        float x, float y, float w, float h, bool fill, const color::color& c,
        float thickness, size_t rel_func) {
    if (w <= 0. || h <= 0.) return;
    DrawBufferObject rect;
    rect.type = fill ? DrawBufferObject::FILLED_RECT : DrawBufferObject::RECT;
    rect.points = {{(double)x, (double)y}, {(double)(x+w), (double)(y+h)}};
    rect.thickness = thickness,
    rect.rel_func = rel_func;
    auto xdiff = render_view.xmax - render_view.xmin;
    auto ydiff = render_view.ymax - render_view.ymin;
    for (size_t i = 0; i < rect.points.size(); ++i) {
        rect.points[i][0] = rect.points[i][0]*1. /
            render_view.swid * xdiff + render_view.xmin;
        rect.points[i][1] = (render_view.shigh - rect.points[i][1])*1. /
            render_view.shigh * ydiff + render_view.ymin;
    }
    if (fill && draw_buf.size()) {
        auto& last_rect = draw_buf.back();
        if (last_rect.type == DrawBufferObject::FILLED_RECT &&
                std::fabs(last_rect.points[0][1] - rect.points[0][1]) < 1e-6 * ydiff &&
                std::fabs(last_rect.points[1][1] - rect.points[1][1]) < 1e-6 * ydiff &&
                std::fabs(last_rect.points[1][0] - rect.points[0][0]) < 1e-6 * xdiff &&
                last_rect.c == c) {
            // Reduce shape count by merging with rectangle to left
            last_rect.points[1][0] = rect.points[1][0];
            return;
        } else if (last_rect.type == DrawBufferObject::FILLED_RECT &&
                std::fabs(last_rect.points[0][0] - rect.points[0][0]) < 1e-6 * xdiff &&
                std::fabs(last_rect.points[1][0] - rect.points[1][0]) < 1e-6 * xdiff &&
                std::fabs(last_rect.points[1][1] - rect.points[0][1]) < 1e-6 * ydiff &&
                last_rect.c == c) {
            // Reduce shape count by merging with rectangle above
            last_rect.points[1][1] = rect.points[1][1];
            return;
        }
    }
    rect.c = c;
    draw_buf.push_back(std::move(rect));
}